

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int BUFFER_size(BUFFER_HANDLE handle,size_t *size)

{
  int iVar1;
  
  iVar1 = 0x1c9;
  if (size != (size_t *)0x0 && handle != (BUFFER_HANDLE)0x0) {
    *size = handle->size;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int BUFFER_size(BUFFER_HANDLE handle, size_t* size)
{
    int result;
    if ((handle == NULL) || (size == NULL))
    {
        /* Codes_SRS_BUFFER_07_022: [BUFFER_size shall return a nonzero value for any error that is encountered.] */
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b = (BUFFER*)handle;
        *size = b->size;
        result = 0;
    }
    return result;
}